

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O2

void __thiscall I2cAnalyzer::~I2cAnalyzer(I2cAnalyzer *this)

{
  I2cAnalyzerResults *pIVar1;
  I2cAnalyzerSettings *pIVar2;
  
  *(undefined ***)this = &PTR__I2cAnalyzer_0010aca8;
  Analyzer::KillThread();
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&(this->mArrowLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  I2cSimulationDataGenerator::~I2cSimulationDataGenerator(&this->mSimulationDataGenerator);
  pIVar1 = (this->mResults)._M_ptr;
  if (pIVar1 != (I2cAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pIVar1 + 8))();
  }
  pIVar2 = (this->mSettings)._M_ptr;
  if (pIVar2 != (I2cAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pIVar2 + 8))();
  }
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

I2cAnalyzer::~I2cAnalyzer()
{
    KillThread();
}